

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall testing::internal::MutexBase::AssertHeld(MutexBase *this)

{
  pthread_t __thread1;
  bool bVar1;
  int iVar2;
  pthread_t __thread2;
  ostream *poVar3;
  void *in_RDI;
  int in_stack_0000002c;
  char *in_stack_00000030;
  GTestLogSeverity in_stack_0000003c;
  GTestLog *this_00;
  bool local_1d;
  GTestLog local_c [3];
  
  local_1d = false;
  if ((*(byte *)((long)in_RDI + 0x28) & 1) != 0) {
    __thread1 = *(pthread_t *)((long)in_RDI + 0x30);
    __thread2 = pthread_self();
    iVar2 = pthread_equal(__thread1,__thread2);
    local_1d = iVar2 != 0;
  }
  bVar1 = IsTrue(local_1d);
  if (!bVar1) {
    this_00 = local_c;
    GTestLog::GTestLog((GTestLog *)this,in_stack_0000003c,in_stack_00000030,in_stack_0000002c);
    poVar3 = GTestLog::GetStream(this_00);
    poVar3 = std::operator<<(poVar3,
                             "Condition has_owner_ && pthread_equal(owner_, pthread_self()) failed. "
                            );
    poVar3 = std::operator<<(poVar3,"The current thread is not holding the mutex @");
    std::ostream::operator<<(poVar3,in_RDI);
    GTestLog::~GTestLog(this_00);
  }
  return;
}

Assistant:

void AssertHeld() const {
    GTEST_CHECK_(has_owner_ && pthread_equal(owner_, pthread_self()))
        << "The current thread is not holding the mutex @" << this;
  }